

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

void reviseTimeZone(QDateTimeData *d,QTimeZone *zone,TransitionResolution resolve)

{
  QDateTimePrivate *pQVar1;
  TransitionOptions resolve_00;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = (int)(zone->d).d - 1U & 3;
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar2 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar2 = (uint)(byte)pQVar1;
  }
  iVar3 = 0;
  if (uVar4 != 3) {
    if (uVar4 == 2) {
      iVar3 = (int)((ulong)(zone->d).d >> 2);
    }
    else if (((ulong)pQVar1 & 1) != 0) {
      d->d = (QDateTimePrivate *)
             ((ulong)pQVar1 & 0xffffffffffffff00 | (ulong)(uVar4 << 4 | uVar2 & 7));
      goto LAB_00126aee;
    }
  }
  QDateTime::Data::detach((Data *)&d->data);
  (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
  super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = uVar4 << 4 | uVar2 & 0xffffff06;
  d->d->m_offsetFromUtc = iVar3;
LAB_00126aee:
  if (uVar4 - 1 < 2) {
    refreshSimpleDateTime(d);
    return;
  }
  resolve_00 = toTransitionOptions(resolve);
  refreshZonedDateTime(d,zone,resolve_00);
  return;
}

Assistant:

static void reviseTimeZone(QDateTimeData &d, const QTimeZone &zone,
                           QDateTime::TransitionResolution resolve)
{
    Qt::TimeSpec spec = zone.timeSpec();
    auto status = mergeSpec(getStatus(d), spec);
    bool reuse = d.isShort();
    int offset = 0;

    switch (spec) {
    case Qt::UTC:
        Q_ASSERT(zone.fixedSecondsAheadOfUtc() == 0);
        break;
    case Qt::OffsetFromUTC:
        reuse = false;
        offset = zone.fixedSecondsAheadOfUtc();
        Q_ASSERT(offset);
        break;
    case Qt::TimeZone:
        reuse = false;
        break;
    case Qt::LocalTime:
        break;
    }

    status &= ~(QDateTimePrivate::ValidDateTime | QDateTimePrivate::DaylightMask);
    if (reuse) {
        d.data.status = status.toInt();
    } else {
        d.detach();
        d->m_status = status & ~QDateTimePrivate::ShortData;
        d->m_offsetFromUtc = offset;
#if QT_CONFIG(timezone)
        if (spec == Qt::TimeZone)
            d->m_timeZone = zone;
#endif // timezone
    }

    if (QTimeZone::isUtcOrFixedOffset(spec))
        refreshSimpleDateTime(d);
    else
        refreshZonedDateTime(d, zone, toTransitionOptions(resolve));
}